

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O0

Vec_Int_t * Ree_ManComputeCuts(Gia_Man_t *p,Vec_Int_t **pvXors,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Hash_IntMan_t *pHash_00;
  Vec_Int_t *pVVar6;
  Vec_Int_t *vData_00;
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar7;
  int *pList1_00;
  int *piVar8;
  bool bVar9;
  Vec_Int_t *local_f8;
  Vec_Int_t *vCuts;
  Vec_Int_t *vData;
  Vec_Int_t *vTemp;
  Vec_Int_t *vAdds;
  Hash_IntMan_t *pHash;
  int nCuts;
  int i;
  int *pList1;
  int *pList0;
  Gia_Obj_t *pObj;
  int fVerbose_local;
  Vec_Int_t **pvXors_local;
  Gia_Man_t *p_local;
  
  pHash._0_4_ = 0;
  pHash_00 = Hash_IntManStart(1000);
  pVVar6 = Vec_IntAlloc(1000);
  vData_00 = Vec_IntAlloc(1000);
  iVar1 = Gia_ManAndNum(p);
  p_00 = Vec_IntAlloc(iVar1 * 0x1e);
  iVar1 = Gia_ManObjNum(p);
  Vec_IntFill(p_00,iVar1,0);
  Gia_ManCleanValue(p);
  pHash._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar9 = false;
    if (pHash._4_4_ < iVar1) {
      pList0 = (int *)Gia_ManCi(p,pHash._4_4_);
      bVar9 = (Gia_Obj_t *)pList0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)pList0);
    iVar3 = Vec_IntSize(p_00);
    Vec_IntWriteEntry(p_00,iVar1,iVar3);
    Vec_IntPush(p_00,1);
    Vec_IntPush(p_00,1);
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)pList0);
    Vec_IntPush(p_00,iVar1);
    Vec_IntPush(p_00,0xaa);
    pHash._4_4_ = pHash._4_4_ + 1;
  }
  if (pvXors != (Vec_Int_t **)0x0) {
    pVVar7 = Vec_IntAlloc(1000);
    *pvXors = pVVar7;
  }
  pHash._4_4_ = 0;
  while( true ) {
    bVar9 = false;
    if (pHash._4_4_ < p->nObjs) {
      pList0 = (int *)Gia_ManObj(p,pHash._4_4_);
      bVar9 = (Gia_Obj_t *)pList0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)pList0);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0((Gia_Obj_t *)pList0,pHash._4_4_);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      piVar8 = Vec_IntEntryP(p_00,iVar1);
      iVar1 = Gia_ObjFaninId1((Gia_Obj_t *)pList0,pHash._4_4_);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      pList1_00 = Vec_IntEntryP(p_00,iVar1);
      if (pvXors == (Vec_Int_t **)0x0) {
        local_f8 = (Vec_Int_t *)0x0;
      }
      else {
        local_f8 = *pvXors;
      }
      Ree_ManCutMerge(p,pHash._4_4_,piVar8,pList1_00,pVVar6,pHash_00,vData_00,local_f8);
      iVar1 = Vec_IntSize(p_00);
      Vec_IntWriteEntry(p_00,pHash._4_4_,iVar1);
      Vec_IntAppend(p_00,pVVar6);
      iVar1 = Vec_IntEntry(pVVar6,0);
      pHash._0_4_ = iVar1 + (uint)pHash;
    }
    pHash._4_4_ = pHash._4_4_ + 1;
  }
  if (fVerbose != 0) {
    uVar2 = Gia_ManAndNum(p);
    iVar1 = Gia_ManAndNum(p);
    iVar3 = Vec_IntSize(p_00);
    iVar4 = Gia_ManAndNum(p);
    printf("AIG nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n",
           ((double)(int)(uint)pHash * 1.0) / (double)iVar1,((double)iVar3 * 1.0) / (double)iVar4,
           (ulong)uVar2,(ulong)(uint)pHash);
  }
  Vec_IntFree(pVVar6);
  Vec_IntFree(p_00);
  pVVar6 = Ree_ManDeriveAdds(pHash_00,vData_00,fVerbose);
  piVar8 = Vec_IntArray(pVVar6);
  iVar1 = Vec_IntSize(pVVar6);
  qsort(piVar8,(long)(iVar1 / 6),0x18,Ree_ManCompare);
  if (fVerbose != 0) {
    iVar1 = Vec_IntSize(pVVar6);
    iVar3 = Vec_IntSize(vData_00);
    uVar2 = Hash_IntManEntryNum(pHash_00);
    iVar4 = Hash_IntManEntryNum(pHash_00);
    iVar5 = Vec_IntSize(pVVar6);
    printf("Adders = %d.  Total cuts = %d.  Hashed cuts = %d.  Hashed/Adders = %.2f.\n",
           ((double)iVar4 * 6.0) / (double)iVar5,(ulong)(uint)(iVar1 / 6),(ulong)(uint)(iVar3 / 3),
           (ulong)uVar2);
  }
  Vec_IntFree(vData_00);
  Hash_IntManStop(pHash_00);
  Ree_ManRemoveTrivial(p,pVVar6);
  Ree_ManRemoveContained(p,pVVar6);
  return pVVar6;
}

Assistant:

Vec_Int_t * Ree_ManComputeCuts( Gia_Man_t * p, Vec_Int_t ** pvXors, int fVerbose )
{
    extern void Ree_ManRemoveTrivial( Gia_Man_t * p, Vec_Int_t * vAdds );
    extern void Ree_ManRemoveContained( Gia_Man_t * p, Vec_Int_t * vAdds );
    Gia_Obj_t * pObj; 
    int * pList0, * pList1, i, nCuts = 0;
    Hash_IntMan_t * pHash = Hash_IntManStart( 1000 );
    Vec_Int_t * vAdds;
    Vec_Int_t * vTemp = Vec_IntAlloc( 1000 );
    Vec_Int_t * vData = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCuts = Vec_IntAlloc( 30 * Gia_ManAndNum(p) );
    Vec_IntFill( vCuts, Gia_ManObjNum(p), 0 );
    Gia_ManCleanValue( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        Vec_IntWriteEntry( vCuts, Gia_ObjId(p, pObj), Vec_IntSize(vCuts) );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, Gia_ObjId(p, pObj) );
        Vec_IntPush( vCuts, 0xAA );
    }
    if ( pvXors ) *pvXors = Vec_IntAlloc( 1000 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pList0 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId0(pObj, i)) );
        pList1 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId1(pObj, i)) );
        Ree_ManCutMerge( p, i, pList0, pList1, vTemp, pHash, vData, pvXors ? *pvXors : NULL );
        Vec_IntWriteEntry( vCuts, i, Vec_IntSize(vCuts) );
        Vec_IntAppend( vCuts, vTemp );
        nCuts += Vec_IntEntry( vTemp, 0 );
    }
    if ( fVerbose )
        printf( "AIG nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n", 
            Gia_ManAndNum(p), nCuts, 1.0*nCuts/Gia_ManAndNum(p), 1.0*Vec_IntSize(vCuts)/Gia_ManAndNum(p) );
    Vec_IntFree( vTemp );
    Vec_IntFree( vCuts );
    vAdds = Ree_ManDeriveAdds( pHash, vData, fVerbose );
    qsort( Vec_IntArray(vAdds), (size_t)(Vec_IntSize(vAdds)/6), 24, (int (*)(const void *, const void *))Ree_ManCompare );
    if ( fVerbose )
        printf( "Adders = %d.  Total cuts = %d.  Hashed cuts = %d.  Hashed/Adders = %.2f.\n", 
            Vec_IntSize(vAdds)/6, Vec_IntSize(vData)/3, Hash_IntManEntryNum(pHash), 6.0*Hash_IntManEntryNum(pHash)/Vec_IntSize(vAdds) );
    Vec_IntFree( vData );
    Hash_IntManStop( pHash );
    Ree_ManRemoveTrivial( p, vAdds );
    Ree_ManRemoveContained( p, vAdds );
    //Ree_ManPrintAdders( vAdds, 1 );
    return vAdds;
}